

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void __thiscall Display::checkWindowSize(Display *this)

{
  int __val;
  int __val_00;
  int mine_count;
  int iVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  pointer pvVar6;
  int required_width;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  undefined1 local_1d8 [24];
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  vStack_1c0;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_1a8 [2];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __val = Controller::getWidth(&this->controller);
  __val_00 = Controller::getHeight(&this->controller);
  Controller::getMinefield((Minefield *)local_1d8,&this->controller);
  mine_count = Minefield::getMineCount((Minefield *)local_1d8);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(local_1a8);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&vStack_1c0);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)local_1d8);
  iVar1 = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IODevice[9])();
  iVar2 = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IODevice[8])();
  iVar7 = __val * 2 + -1;
  iVar3 = getMaxTextWidth(mine_count);
  if (iVar3 <= iVar7) {
    iVar3 = iVar7;
  }
  if ((__val_00 + 3 <= iVar2) && (iVar3 < iVar1)) {
    return;
  }
  iVar3 = getMaxTextWidth(mine_count);
  if (iVar7 < iVar3) {
    iVar7 = iVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_1f8,iVar7 + 1);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_258._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_258._M_dataplus._M_p == psVar5) {
    local_258.field_2._M_allocated_capacity = *psVar5;
    local_258.field_2._8_8_ = plVar4[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar5;
  }
  local_258._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_f0,__val_00 + 3);
  std::operator+(&local_d0,&local_258,&local_f0);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_238._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_238._M_dataplus._M_p == psVar5) {
    local_238.field_2._M_allocated_capacity = *psVar5;
    local_238.field_2._8_8_ = plVar4[3];
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar5;
  }
  local_238._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_110,__val);
  std::operator+(&local_b0,&local_238,&local_110);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_218._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_218._M_dataplus._M_p == psVar5) {
    local_218.field_2._M_allocated_capacity = *psVar5;
    local_218.field_2._8_8_ = plVar4[3];
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar5;
  }
  local_218._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_130,__val_00);
  std::operator+(&local_90,&local_218,&local_130);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_298._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_298._M_dataplus._M_p == psVar5) {
    local_298.field_2._M_allocated_capacity = *psVar5;
    local_298.field_2._8_4_ = (undefined4)plVar4[3];
    local_298.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar5;
  }
  local_298._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  iVar3 = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IODevice[9])();
  std::__cxx11::to_string(&local_150,iVar3);
  std::operator+(&local_70,&local_298,&local_150);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_278._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_278._M_dataplus._M_p == psVar5) {
    local_278.field_2._M_allocated_capacity = *psVar5;
    local_278.field_2._8_4_ = (undefined4)plVar4[3];
    local_278.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar5;
  }
  local_278._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  iVar3 = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IODevice[8])();
  std::__cxx11::to_string(&local_170,iVar3);
  std::operator+(&local_50,&local_278,&local_170);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_1d8._0_8_ = *plVar4;
  pvVar6 = (pointer)(plVar4 + 2);
  if ((pointer)local_1d8._0_8_ == pvVar6) {
    local_1d8._16_8_ =
         (pvVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    vStack_1c0.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar4[3];
    local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
  }
  else {
    local_1d8._16_8_ =
         (pvVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
  }
  local_1d8._8_8_ = plVar4[1];
  *plVar4 = (long)pvVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)local_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Display::checkWindowSize() {
    int minefield_width = controller.getWidth();
    int minefield_height = controller.getHeight();
    int mine_count = controller.getMinefield().getMineCount();

    if (!isWindowSizeSufficient(minefield_width, minefield_height, mine_count, io->getWidth(), io->getHeight())) {
        int required_width, required_height;
        std::tie(required_width, required_height) = getRequiredWindowSize(minefield_width, minefield_height, mine_count); 
        throw std::runtime_error(std::to_string(required_width) + "x" + std::to_string(required_height) + " terminal required to display this " + std::to_string(minefield_width) + "x" + std::to_string(minefield_height) + " minefield (Current: " + std::to_string(io->getWidth()) + "x" + std::to_string(io->getHeight()) + ")");
    }
}